

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareTestComputeShader
          (GPUShaderFP64Test2 *this,GLchar *uniform_definitions,GLchar *uniform_verification,
          string *out_source_code)

{
  size_t search_position;
  string string;
  size_t local_50;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "#version 420 core\n#extension GL_ARB_compute_shader          : require\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nUNIFORM_DEFINITIONSlayout(r32i) writeonly uniform iimage2D result;\n\nvoid main()\n{\nUNIFORM_VERIFICATION\n    imageStore(result, ivec2(gl_WorkGroupID.xy), ivec4(verification_result, 0, 0, 0));\n}\n\n"
             ,(allocator<char> *)&local_50);
  local_50 = 0;
  Utils::replaceToken("UNIFORM_DEFINITIONS",&local_50,uniform_definitions,&local_48);
  Utils::replaceToken("UNIFORM_VERIFICATION",&local_50,uniform_verification,&local_48);
  std::__cxx11::string::_M_assign((string *)out_source_code);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareTestComputeShader(const glw::GLchar* uniform_definitions,
												  const glw::GLchar* uniform_verification,
												  std::string&		 out_source_code) const
{
	/* Shader template */
	static const glw::GLchar* test_shader_template_code =
		"#version 420 core\n"
		"#extension GL_ARB_compute_shader          : require\n"
		"#extension GL_ARB_shader_image_load_store : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"UNIFORM_DEFINITIONS"
		"layout(r32i) writeonly uniform iimage2D result;\n"
		"\n"
		"void main()\n"
		"{\n"
		"UNIFORM_VERIFICATION"
		"\n"
		"    imageStore(result, ivec2(gl_WorkGroupID.xy), ivec4(verification_result, 0, 0, 0));\n"
		"}\n"
		"\n";

	std::string string = test_shader_template_code;

	/* Tokens */
	static const glw::GLchar* uni_def_token = "UNIFORM_DEFINITIONS";
	static const glw::GLchar* uni_ver_token = "UNIFORM_VERIFICATION";

	size_t search_position = 0;

	/* Replace tokens */
	Utils::replaceToken(uni_def_token, search_position, uniform_definitions, string);
	Utils::replaceToken(uni_ver_token, search_position, uniform_verification, string);

	/* Store resuls */
	out_source_code = string;
}